

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

void __thiscall helics::apps::Recorder::loadTextFile(Recorder *this,string *textFile)

{
  string_view quoteChars;
  bool bVar1;
  istream *piVar2;
  size_type sVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  int iVar7;
  string_view line;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view sourceEndpoint;
  string_view key;
  string_view key_00;
  string_view destEndpoint;
  string_view endpoint;
  string_view sourceEndpoint_00;
  string_view destEndpoint_00;
  string_view captureDesc;
  string_view sourceEndpoint_01;
  string_view destEndpoint_01;
  delimiter_compression in_stack_fffffffffffffd68;
  string local_290;
  stringVector blk;
  string str;
  ifstream infile;
  
  std::ifstream::ifstream((istream *)&infile,(string *)textFile,_S_in);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  iVar7 = 1;
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&infile,(string *)&str);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      std::__cxx11::string::~string((string *)&str);
      std::ifstream::~ifstream(&infile);
      return;
    }
    if (str._M_string_length != 0) {
      sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_not_of(&str," \t\n\r",0);
      if ((sVar3 != 0xffffffffffffffff) && (str._M_dataplus._M_p[sVar3] != '#')) {
        pcVar6 = (char *)0x3;
        quoteChars._M_str = (char *)0x330554;
        quoteChars._M_len = 3;
        line._M_str = (char *)0x3;
        line._M_len = (size_t)str._M_dataplus._M_p;
        gmlc::utilities::stringOps::splitlineQuotes_abi_cxx11_
                  (&blk,(stringOps *)str._M_string_length,line,(string_view)ZEXT816(0x32f277),
                   quoteChars,in_stack_fffffffffffffd68);
        lVar4 = (long)blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (lVar4 == 1) {
          str_02._M_str = pcVar6;
          str_02._M_len =
               (size_t)((blk.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                    (&local_290,
                     (stringOps *)
                     (blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,str_02);
          key_00._M_str = local_290._M_dataplus._M_p;
          key_00._M_len = local_290._M_string_length;
          addSubscription(this,key_00);
LAB_00166fa5:
          std::__cxx11::string::~string((string *)&local_290);
        }
        else {
          if (lVar4 == 2) {
            bVar1 = std::operator==(blk.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"subscription");
            if (!bVar1) {
              bVar1 = std::operator==(blk.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,"s");
              if (!bVar1) {
                bVar1 = std::operator==(blk.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"sub");
                if (!bVar1) {
                  bVar1 = std::operator==(blk.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,"tag");
                  if (!bVar1) {
                    bVar1 = std::operator==(blk.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,"endpoint");
                    if (!bVar1) {
                      bVar1 = std::operator==(blk.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,"ept");
                      if (!bVar1) {
                        bVar1 = std::operator==(blk.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start,"e");
                        if (!bVar1) {
                          bVar1 = std::operator==(blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "sourceclone");
                          if (!bVar1) {
                            bVar1 = std::operator==(blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,"source"
                                                  );
                            if (!bVar1) {
                              bVar1 = std::operator==(blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,"src");
                              if (!bVar1) {
                                bVar1 = std::operator==(blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "destclone");
                                if (!bVar1) {
                                  bVar1 = std::operator==(blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,"dest");
                                  if (!bVar1) {
                                    bVar1 = std::operator==(blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "destination");
                                    if (!bVar1) {
                                      bVar1 = std::operator==(blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "capture");
                                      if (bVar1) {
                                        str_07._M_str = pcVar6;
                                        str_07._M_len =
                                             (size_t)blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_dataplus._M_p;
                                        gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                                  (&local_290,
                                                   (stringOps *)
                                                   blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_string_length,str_07);
                                        captureDesc._M_str = local_290._M_dataplus._M_p;
                                        captureDesc._M_len = local_290._M_string_length;
                                        addCapture(this,captureDesc);
                                      }
                                      else {
                                        bVar1 = std::operator==(blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,"clone")
                                        ;
                                        if (!bVar1) goto LAB_0016721f;
                                        str_08._M_str = pcVar6;
                                        str_08._M_len =
                                             (size_t)blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_dataplus._M_p;
                                        gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                                  (&local_290,
                                                   (stringOps *)
                                                   blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_string_length,str_08);
                                        sourceEndpoint_01._M_str = local_290._M_dataplus._M_p;
                                        sourceEndpoint_01._M_len = local_290._M_string_length;
                                        addSourceEndpointClone(this,sourceEndpoint_01);
                                        std::__cxx11::string::~string((string *)&local_290);
                                        str_09._M_str = pcVar6;
                                        str_09._M_len =
                                             (size_t)blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_dataplus._M_p;
                                        gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                                  (&local_290,
                                                   (stringOps *)
                                                   blk.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_string_length,str_09);
                                        destEndpoint_01._M_str = local_290._M_dataplus._M_p;
                                        destEndpoint_01._M_len = local_290._M_string_length;
                                        addDestEndpointClone(this,destEndpoint_01);
                                      }
                                      goto LAB_00166fa5;
                                    }
                                  }
                                }
                                str_06._M_str = pcVar6;
                                str_06._M_len =
                                     (size_t)blk.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             _M_dataplus._M_p;
                                gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                          (&local_290,
                                           (stringOps *)
                                           blk.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].
                                           _M_string_length,str_06);
                                destEndpoint_00._M_str = local_290._M_dataplus._M_p;
                                destEndpoint_00._M_len = local_290._M_string_length;
                                addDestEndpointClone(this,destEndpoint_00);
                                goto LAB_00166fa5;
                              }
                            }
                          }
                          str_05._M_str = pcVar6;
                          str_05._M_len =
                               (size_t)blk.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                          ;
                          gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                    (&local_290,
                                     (stringOps *)
                                     blk.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length,
                                     str_05);
                          sourceEndpoint_00._M_str = local_290._M_dataplus._M_p;
                          sourceEndpoint_00._M_len = local_290._M_string_length;
                          addSourceEndpointClone(this,sourceEndpoint_00);
                          goto LAB_00166fa5;
                        }
                      }
                    }
                    str_04._M_str = pcVar6;
                    str_04._M_len =
                         (size_t)blk.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                              (&local_290,
                               (stringOps *)
                               blk.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length,str_04)
                    ;
                    endpoint._M_str = local_290._M_dataplus._M_p;
                    endpoint._M_len = local_290._M_string_length;
                    addEndpoint(this,endpoint);
                    goto LAB_00166fa5;
                  }
                }
              }
            }
            str_01._M_str = pcVar6;
            str_01._M_len =
                 (size_t)blk.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
            gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                      (&local_290,
                       (stringOps *)
                       blk.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length,str_01);
            key._M_str = local_290._M_dataplus._M_p;
            key._M_len = local_290._M_string_length;
            addSubscription(this,key);
            goto LAB_00166fa5;
          }
          if (lVar4 == 3) {
            bVar1 = std::operator==(blk.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"clone");
            if (bVar1) {
              bVar1 = std::operator==(blk.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1,"source");
              if (!bVar1) {
                bVar1 = std::operator==(blk.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1,"src");
                if (!bVar1) {
                  bVar1 = std::operator==(blk.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1,"dest");
                  if (!bVar1) {
                    bVar1 = std::operator==(blk.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1,
                                            "destination");
                    if (!bVar1) goto LAB_0016721f;
                  }
                  str_03._M_str = pcVar6;
                  str_03._M_len =
                       (size_t)blk.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
                  gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                            (&local_290,
                             (stringOps *)
                             blk.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length,str_03);
                  destEndpoint._M_str = local_290._M_dataplus._M_p;
                  destEndpoint._M_len = local_290._M_string_length;
                  addDestEndpointClone(this,destEndpoint);
                  goto LAB_00166fa5;
                }
              }
              str_00._M_str = pcVar6;
              str_00._M_len =
                   (size_t)blk.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
              gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                        (&local_290,
                         (stringOps *)
                         blk.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length,str_00);
              sourceEndpoint._M_str = local_290._M_dataplus._M_p;
              sourceEndpoint._M_len = local_290._M_string_length;
              addSourceEndpointClone(this,sourceEndpoint);
              goto LAB_00166fa5;
            }
LAB_0016721f:
            poVar5 = std::operator<<((ostream *)&std::cerr,"Unable to process line ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
            poVar5 = std::operator<<(poVar5,':');
            poVar5 = std::operator<<(poVar5,(string *)&str);
            std::operator<<(poVar5,'\n');
          }
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&blk);
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void Recorder::loadTextFile(const std::string& textFile)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT

    std::ifstream infile(textFile);
    std::string str;
    int lineCount = 0;
    while (std::getline(infile, str)) {
        ++lineCount;
        if (str.empty()) {
            continue;
        }
        auto firstChar = str.find_first_not_of(" \t\n\r\0");
        if ((firstChar == std::string::npos) || (str[firstChar] == '#')) {
            continue;
        }
        auto blk = splitlineQuotes(str, ",\t ", default_quote_chars, delimiter_compression::on);

        switch (blk.size()) {
            case 1:
                addSubscription(removeQuotes(blk[0]));
                break;
            case 2:
                if ((blk[0] == "subscription") || (blk[0] == "s") || (blk[0] == "sub") ||
                    (blk[0] == "tag")) {
                    addSubscription(removeQuotes(blk[1]));
                } else if ((blk[0] == "endpoint") || (blk[0] == "ept") || (blk[0] == "e")) {
                    addEndpoint(removeQuotes(blk[1]));
                } else if ((blk[0] == "sourceclone") || (blk[0] == "source") || (blk[0] == "src")) {
                    addSourceEndpointClone(removeQuotes(blk[1]));
                } else if ((blk[0] == "destclone") || (blk[0] == "dest") ||
                           (blk[0] == "destination")) {
                    addDestEndpointClone(removeQuotes(blk[1]));
                } else if (blk[0] == "capture") {
                    addCapture(removeQuotes(blk[1]));
                } else if (blk[0] == "clone") {
                    addSourceEndpointClone(removeQuotes(blk[1]));
                    addDestEndpointClone(removeQuotes(blk[1]));
                } else {
                    std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                }
                break;
            case 3:
                if (blk[0] == "clone") {
                    if ((blk[1] == "source") || (blk[1] == "src")) {
                        addSourceEndpointClone(removeQuotes(blk[2]));
                    } else if ((blk[1] == "dest") || (blk[1] == "destination")) {
                        addDestEndpointClone(removeQuotes(blk[2]));
                    } else {
                        std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                    }
                } else {
                    std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                }
                break;
            default:
                break;
        }
    }
    infile.close();
}